

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O2

UnicodeSet *
icu_63::number::impl::CurrencySpacingEnabledModifier::getUnicodeSet
          (UnicodeSet *__return_storage_ptr__,DecimalFormatSymbols *symbols,EPosition position,
          EAffix affix,UErrorCode *status)

{
  int8_t iVar1;
  UnicodeString *this;
  UnicodeSet *o;
  ConstChar16Ptr local_58;
  ConstChar16Ptr local_50;
  char16_t *local_48;
  char16_t *local_38;
  
  umtx_initOnce((UInitOnce *)&::(anonymous_namespace)::gDefaultCurrencySpacingInitOnce,
                anon_unknown.dwarf_170c7b::initDefaultCurrencySpacing,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this = DecimalFormatSymbols::getPatternForCurrencySpacing
                     (symbols,(uint)(position != IN_CURRENCY),affix == SUFFIX,status);
    local_50.p_ = L"[:digit:]";
    iVar1 = UnicodeString::compare(this,&local_50,-1);
    local_38 = local_50.p_;
    o = ::(anonymous_namespace)::UNISET_DIGIT;
    if (iVar1 != '\0') {
      local_58.p_ = L"[:^S:]";
      iVar1 = UnicodeString::compare(this,&local_58,-1);
      local_48 = local_58.p_;
      o = ::(anonymous_namespace)::UNISET_NOTS;
      if (iVar1 != '\0') {
        UnicodeSet::UnicodeSet(__return_storage_ptr__,this,status);
        return __return_storage_ptr__;
      }
    }
    UnicodeSet::UnicodeSet(__return_storage_ptr__,o);
  }
  else {
    UnicodeSet::UnicodeSet(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeSet
CurrencySpacingEnabledModifier::getUnicodeSet(const DecimalFormatSymbols &symbols, EPosition position,
                                              EAffix affix, UErrorCode &status) {
    // Ensure the static defaults are initialized:
    umtx_initOnce(gDefaultCurrencySpacingInitOnce, &initDefaultCurrencySpacing, status);
    if (U_FAILURE(status)) {
        return UnicodeSet();
    }

    const UnicodeString& pattern = symbols.getPatternForCurrencySpacing(
            position == IN_CURRENCY ? UNUM_CURRENCY_MATCH : UNUM_CURRENCY_SURROUNDING_MATCH,
            affix == SUFFIX,
            status);
    if (pattern.compare(u"[:digit:]", -1) == 0) {
        return *UNISET_DIGIT;
    } else if (pattern.compare(u"[:^S:]", -1) == 0) {
        return *UNISET_NOTS;
    } else {
        return UnicodeSet(pattern, status);
    }
}